

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_move16(m68k_info *info,int *data,int *modes)

{
  int iVar1;
  m68k_address_mode mVar2;
  cs_m68k *pcVar3;
  m68k_address_mode *pmVar4;
  long lVar5;
  
  pcVar3 = build_init_op(info,0x120,2,0);
  pmVar4 = &pcVar3->operands[0].address_mode;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    iVar1 = data[lVar5];
    mVar2 = modes[lVar5];
    pmVar4[-1] = M68K_OP_MEM;
    if ((mVar2 == M68K_AM_REGI_ADDR_POST_INC) || (mVar2 == M68K_AM_REG_DIRECT_ADDR)) {
      *pmVar4 = mVar2;
      (((cs_m68k_op *)(pmVar4 + -0xd))->field_0).reg = iVar1 + M68K_REG_A0;
    }
    else {
      *pmVar4 = mVar2;
      ((cs_m68k_op *)(pmVar4 + -0xd))->field_0 =
           (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)iVar1;
    }
    pmVar4 = pmVar4 + 0xe;
  }
  return;
}

Assistant:

static void build_move16(m68k_info *info, int data[2], int modes[2])
{
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE16, 2, 0);
	int i;

	for (i = 0; i < 2; ++i) {
		cs_m68k_op* op = &ext->operands[i];
		const int d = data[i];
		const int m = modes[i];

		op->type = M68K_OP_MEM;

		if (m == M68K_AM_REGI_ADDR_POST_INC || m == M68K_AM_REG_DIRECT_ADDR) {
			op->address_mode = m;
			op->reg = M68K_REG_A0 + d;
		} else {
			op->address_mode = m;
			op->imm = d;
		}
	}
}